

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O3

void __thiscall
HighsDomain::ConflictPoolPropagation::conflictAdded(ConflictPoolPropagation *this,HighsInt conflict)

{
  double dVar1;
  int iVar2;
  HighsConflictPool *pHVar3;
  pointer ppVar4;
  pointer pHVar5;
  pointer piVar6;
  pointer puVar7;
  HighsInt HVar8;
  HighsBoundType HVar9;
  int iVar10;
  vector<int,_std::allocator<int>_> *pvVar11;
  int iVar12;
  HighsBoundType *pHVar13;
  pointer pWVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  double *pdVar24;
  int iVar25;
  int local_3c [3];
  
  pHVar3 = this->conflictpool_;
  ppVar4 = (pHVar3->conflictRanges_).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar15 = ppVar4[conflict].first;
  iVar10 = ppVar4[conflict].second;
  if (*(int *)&(this->conflictFlag_).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
      *(int *)&(this->conflictFlag_).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start <= conflict) {
    std::
    vector<HighsDomain::ConflictPoolPropagation::WatchedLiteral,_std::allocator<HighsDomain::ConflictPoolPropagation::WatchedLiteral>_>
    ::resize(&this->watchedLiterals_,(long)(conflict * 2 + 2));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->conflictFlag_,(long)(conflict + 1));
  }
  if (iVar15 != iVar10) {
    lVar16 = (long)iVar15;
    iVar18 = conflict * 2;
    lVar17 = lVar16 << 4;
    iVar12 = 0;
    iVar21 = iVar15;
    do {
      pHVar5 = (pHVar3->conflictEntries_).
               super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar1 = *(double *)((long)&pHVar5->boundval + lVar17);
      iVar23 = *(int *)((long)&pHVar5->column + lVar17);
      if (*(int *)((long)&pHVar5->boundtype + lVar17) == 0) {
        if ((this->domain->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar23] < dVar1) goto LAB_002900cc;
      }
      else if (dVar1 < (this->domain->col_upper_).
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar23]) {
LAB_002900cc:
        pdVar24 = (double *)((long)&pHVar5->boundval + lVar17);
        iVar23 = iVar12 + iVar18;
        dVar1 = pdVar24[1];
        pWVar14 = (this->watchedLiterals_).
                  super__Vector_base<HighsDomain::ConflictPoolPropagation::WatchedLiteral,_std::allocator<HighsDomain::ConflictPoolPropagation::WatchedLiteral>_>
                  ._M_impl.super__Vector_impl_data._M_start + iVar23;
        (pWVar14->domchg).boundval = *pdVar24;
        *(double *)&(pWVar14->domchg).column = dVar1;
        pWVar14 = (this->watchedLiterals_).
                  super__Vector_base<HighsDomain::ConflictPoolPropagation::WatchedLiteral,_std::allocator<HighsDomain::ConflictPoolPropagation::WatchedLiteral>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pvVar11 = &this->colLowerWatched_;
        if (pWVar14[iVar23].domchg.boundtype != kLower) {
          pvVar11 = &this->colUpperWatched_;
        }
        iVar2 = pWVar14[iVar23].domchg.column;
        piVar6 = (pvVar11->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pWVar14[iVar23].prev = -1;
        iVar22 = piVar6[iVar2];
        pWVar14[iVar23].next = iVar22;
        if ((long)iVar22 != -1) {
          pWVar14[iVar22].prev = iVar23;
          piVar6[iVar2] = iVar23;
        }
        iVar12 = iVar12 + 1;
        if (iVar12 == 2) {
          iVar12 = 2;
          goto LAB_0029024b;
        }
      }
      lVar17 = lVar17 + 0x10;
      iVar21 = iVar21 + 1;
    } while (iVar10 != iVar21);
    if (iVar12 != 0) {
      if ((iVar12 == 1) && (iVar12 = 1, iVar15 != iVar10)) {
        pHVar13 = &(pHVar3->conflictEntries_).
                   super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl
                   .super__Vector_impl_data._M_start[lVar16].boundtype;
        iVar21 = -1;
        iVar18 = -1;
        do {
          pvVar11 = &this->domain->colUpperPos_;
          if (*pHVar13 == kLower) {
            pvVar11 = &this->domain->colLowerPos_;
          }
          iVar23 = (pvVar11->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start[(int)pHVar13[-1]];
          if (iVar21 < iVar23) {
            iVar21 = iVar23;
            iVar18 = iVar15;
          }
          pHVar13 = pHVar13 + 4;
          iVar15 = iVar15 + 1;
        } while (iVar10 != iVar15);
        if (iVar18 != -1) {
          iVar10 = conflict * 2 + 1;
          pHVar5 = (pHVar3->conflictEntries_).
                   super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl
                   .super__Vector_impl_data._M_start + iVar18;
          HVar8 = pHVar5->column;
          HVar9 = pHVar5->boundtype;
          pWVar14 = (this->watchedLiterals_).
                    super__Vector_base<HighsDomain::ConflictPoolPropagation::WatchedLiteral,_std::allocator<HighsDomain::ConflictPoolPropagation::WatchedLiteral>_>
                    ._M_impl.super__Vector_impl_data._M_start + iVar10;
          (pWVar14->domchg).boundval = pHVar5->boundval;
          (pWVar14->domchg).column = HVar8;
          (pWVar14->domchg).boundtype = HVar9;
          pWVar14 = (this->watchedLiterals_).
                    super__Vector_base<HighsDomain::ConflictPoolPropagation::WatchedLiteral,_std::allocator<HighsDomain::ConflictPoolPropagation::WatchedLiteral>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          iVar15 = pWVar14[iVar10].domchg.column;
          pvVar11 = &this->colUpperWatched_;
          if (pWVar14[iVar10].domchg.boundtype == kLower) {
            pvVar11 = &this->colLowerWatched_;
          }
          piVar6 = (pvVar11->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pWVar14[iVar10].prev = -1;
          iVar18 = piVar6[iVar15];
          pWVar14[iVar10].next = iVar18;
          if ((long)iVar18 != -1) {
            pWVar14[iVar18].prev = iVar10;
            piVar6[iVar15] = iVar10;
          }
        }
      }
      goto LAB_0029024b;
    }
    if (iVar15 != iVar10) {
      pHVar13 = &(pHVar3->conflictEntries_).
                 super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar16].boundtype;
      local_3c[0] = 0;
      local_3c[2] = 0;
      iVar21 = 0;
      uVar19 = 0;
      iVar12 = 0;
      do {
        pvVar11 = &this->domain->colUpperPos_;
        if (*pHVar13 == kLower) {
          pvVar11 = &this->domain->colLowerPos_;
        }
        iVar23 = (pvVar11->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[(int)pHVar13[-1]];
        iVar2 = iVar15;
        if (uVar19 == 2) {
          iVar22 = iVar21;
          iVar25 = local_3c[2];
          if (iVar21 < iVar23) goto LAB_002902e6;
LAB_0029030e:
          uVar19 = 2;
          iVar21 = iVar22;
          iVar2 = local_3c[0];
          iVar23 = iVar12;
          local_3c[2] = iVar25;
        }
        else if (uVar19 == 1) {
LAB_002902e6:
          uVar19 = 2;
          iVar22 = iVar23;
          iVar21 = iVar12;
          local_3c[2] = local_3c[0];
          iVar25 = iVar15;
          if (iVar23 <= iVar12) goto LAB_0029030e;
        }
        else {
          uVar19 = 1;
        }
        local_3c[0] = iVar2;
        iVar15 = iVar15 + 1;
        pHVar13 = pHVar13 + 4;
        iVar12 = iVar23;
      } while (iVar10 != iVar15);
      pWVar14 = (this->watchedLiterals_).
                super__Vector_base<HighsDomain::ConflictPoolPropagation::WatchedLiteral,_std::allocator<HighsDomain::ConflictPoolPropagation::WatchedLiteral>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar16 = (long)iVar18 * 0x18;
      uVar20 = 0;
      do {
        pHVar5 = (pHVar3->conflictEntries_).
                 super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
                 super__Vector_impl_data._M_start + local_3c[uVar20 * 2];
        dVar1 = *(double *)&pHVar5->column;
        pdVar24 = (double *)((long)&(pWVar14->domchg).boundval + lVar16);
        *pdVar24 = pHVar5->boundval;
        pdVar24[1] = dVar1;
        pWVar14 = (this->watchedLiterals_).
                  super__Vector_base<HighsDomain::ConflictPoolPropagation::WatchedLiteral,_std::allocator<HighsDomain::ConflictPoolPropagation::WatchedLiteral>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pvVar11 = &this->colLowerWatched_;
        if (*(int *)((long)&(pWVar14->domchg).boundtype + lVar16) != 0) {
          pvVar11 = &this->colUpperWatched_;
        }
        iVar15 = *(int *)((long)&(pWVar14->domchg).column + lVar16);
        piVar6 = (pvVar11->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        *(undefined4 *)((long)&pWVar14->prev + lVar16) = 0xffffffff;
        iVar10 = piVar6[iVar15];
        *(int *)((long)&pWVar14->next + lVar16) = iVar10;
        if ((long)iVar10 != -1) {
          iVar21 = iVar18 + (int)uVar20;
          pWVar14[iVar10].prev = iVar21;
          piVar6[iVar15] = iVar21;
        }
        uVar20 = uVar20 + 1;
        lVar16 = lVar16 + 0x18;
      } while (uVar19 != uVar20);
    }
  }
  iVar12 = 0;
LAB_0029024b:
  puVar7 = (this->conflictFlag_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar7[conflict] = (byte)iVar12 | puVar7[conflict] & 4;
  markPropagateConflict(this,conflict);
  return;
}

Assistant:

void HighsDomain::ConflictPoolPropagation::conflictAdded(HighsInt conflict) {
  HighsInt start = conflictpool_->getConflictRanges()[conflict].first;
  HighsInt end = conflictpool_->getConflictRanges()[conflict].second;
  const std::vector<HighsDomainChange>& conflictEntries =
      conflictpool_->getConflictEntryVector();

  if (HighsInt(conflictFlag_.size()) <= conflict) {
    watchedLiterals_.resize(2 * conflict + 2);
    conflictFlag_.resize(conflict + 1);
  }

  HighsInt numWatched = 0;
  for (HighsInt i = start; i != end; ++i) {
    if (domain->isActive(conflictEntries[i])) continue;
    HighsInt watchPos = 2 * conflict + numWatched;
    watchedLiterals_[watchPos].domchg = conflictEntries[i];
    linkWatchedLiteral(watchPos);
    if (++numWatched == 2) break;
  }
  switch (numWatched) {
    case 0: {
      std::array<std::pair<HighsInt, HighsInt>, 2> latestActive;
      HighsInt numActive = 0;
      for (HighsInt i = start; i != end; ++i) {
        HighsInt pos = conflictEntries[i].boundtype == HighsBoundType::kLower
                           ? domain->colLowerPos_[conflictEntries[i].column]
                           : domain->colUpperPos_[conflictEntries[i].column];
        switch (numActive) {
          case 0:
            latestActive[0] = std::make_pair(pos, i);
            numActive = 1;
            break;
          case 1:
            latestActive[1] = std::make_pair(pos, i);
            numActive = 2;
            if (latestActive[0].first < latestActive[1].first)
              std::swap(latestActive[0], latestActive[1]);
            break;
          case 2:
            if (pos > latestActive[1].first) {
              latestActive[1] = std::make_pair(pos, i);
              if (latestActive[0].first < latestActive[1].first)
                std::swap(latestActive[0], latestActive[1]);
            }
        }
      }
      for (HighsInt i = 0; i < numActive; ++i) {
        HighsInt watchPos = 2 * conflict + i;
        watchedLiterals_[watchPos].domchg =
            conflictEntries[latestActive[i].second];
        linkWatchedLiteral(watchPos);
      }
      break;
    }
    case 1: {
      HighsInt latestActive = -1;
      HighsInt latestPos = -1;

      for (HighsInt i = start; i != end; ++i) {
        HighsInt pos = conflictEntries[i].boundtype == HighsBoundType::kLower
                           ? domain->colLowerPos_[conflictEntries[i].column]
                           : domain->colUpperPos_[conflictEntries[i].column];
        if (pos > latestPos) {
          latestActive = i;
          latestPos = pos;
        }
      }
      if (latestActive != -1) {
        HighsInt watchPos = 2 * conflict + 1;
        watchedLiterals_[watchPos].domchg = conflictEntries[latestActive];
        linkWatchedLiteral(watchPos);
      }
      break;
    }
    case 2:
      break;
  }

  conflictFlag_[conflict] = numWatched | (conflictFlag_[conflict] & 4);
  markPropagateConflict(conflict);
}